

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

ssize_t base64_encode_using_maps
                  (base64_maps_t *maps,char *dest,size_t destlen,char *src,size_t srclen)

{
  long lVar1;
  undefined1 auVar2 [16];
  int *piVar3;
  size_t srclen_00;
  long lVar4;
  ulong uVar5;
  ssize_t sVar6;
  char *src_00;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = srclen + 2;
  if (destlen < (SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffcU)) {
    piVar3 = __errno_location();
    *piVar3 = 0x4b;
    sVar6 = -1;
  }
  else {
    if (srclen < 3) {
      uVar5 = 0;
      sVar6 = 0;
      srclen_00 = srclen;
    }
    else {
      lVar4 = 0;
      sVar6 = 0;
      src_00 = src;
      do {
        base64_encode_triplet_using_maps(maps,dest + sVar6,src_00);
        sVar6 = sVar6 + 4;
        src_00 = src_00 + 3;
        lVar1 = lVar4 + srclen;
        lVar4 = lVar4 + -3;
      } while (2 < lVar1 - 3U);
      uVar5 = -lVar4;
      srclen_00 = lVar4 + srclen;
    }
    if (uVar5 < srclen) {
      base64_encode_tail_using_maps(maps,dest + sVar6,src + uVar5,srclen_00);
      sVar6 = sVar6 + 4;
    }
    memset(dest + sVar6,0,destlen - sVar6);
  }
  return sVar6;
}

Assistant:

ssize_t base64_encode_using_maps(const base64_maps_t *maps,
				 char *dest, const size_t destlen,
				 const char *src, const size_t srclen)
{
	size_t src_offset = 0;
	size_t dest_offset = 0;

	if (destlen < base64_encoded_length(srclen)) {
		errno = EOVERFLOW;
		return -1;
	}

	while (srclen - src_offset >= 3) {
		base64_encode_triplet_using_maps(maps, &dest[dest_offset], &src[src_offset]);
		src_offset += 3;
		dest_offset += 4;
	}

	if (src_offset < srclen) {
		base64_encode_tail_using_maps(maps, &dest[dest_offset], &src[src_offset], srclen-src_offset);
		dest_offset += 4;
	}

	memset(&dest[dest_offset], '\0', destlen-dest_offset);

	return dest_offset;
}